

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

uint gf_matr_det(uint **M,uint rows,uint cols)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint **ppuVar5;
  void *pvVar6;
  uint **ppuVar7;
  undefined8 *puVar8;
  undefined4 uVar9;
  undefined8 in_RCX;
  long lVar10;
  uint extraout_EDX;
  uint cols_00;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  undefined4 in_register_00000034;
  undefined4 *puVar15;
  ulong uVar16;
  ulong in_R8;
  ulong in_R9;
  ulong uVar17;
  uint uVar18;
  
  puVar15 = (undefined4 *)CONCAT44(in_register_00000034,rows);
  lVar10 = CONCAT71((int7)((ulong)in_RCX >> 8),rows == 2 || rows == cols);
  if (rows == 2 || rows == cols) {
    uVar16 = (ulong)**M;
    uVar17 = (ulong)M[1][1];
    uVar18 = 0;
    uVar14 = 0;
    if (uVar17 != 0 && uVar16 != 0) {
      uVar14 = index_of[uVar17] + index_of[uVar16];
      uVar4 = (index_of[uVar17] - 0xff) + index_of[uVar16];
      if (uVar14 < 0xff) {
        uVar4 = uVar14;
      }
      uVar14 = alpha_of[uVar4];
    }
    uVar17 = (ulong)*M[1];
    uVar16 = (ulong)(*M)[1];
    if (uVar16 != 0 && uVar17 != 0) {
      uVar18 = index_of[uVar16] + index_of[uVar17];
      uVar4 = (index_of[uVar16] - 0xff) + index_of[uVar17];
      if (uVar18 < 0xff) {
        uVar4 = uVar18;
      }
      uVar18 = alpha_of[uVar4];
    }
    return uVar18 ^ uVar14;
  }
  gf_matr_det_cold_1();
  uVar14 = (uint)in_R8;
  if (extraout_EDX == uVar14) {
    ppuVar5 = matrix_new((uint)puVar15,(uint)in_R9);
    if ((uint)puVar15 != 0) {
      uVar16 = 0;
      do {
        if ((uint)in_R9 != 0) {
          puVar2 = ppuVar5[uVar16];
          uVar17 = 0;
          do {
            puVar2[uVar17] = 0;
            if (uVar14 != 0) {
              puVar3 = M[uVar16];
              uVar18 = puVar2[uVar17];
              uVar12 = 0;
              do {
                uVar4 = 0;
                if (((ulong)puVar3[uVar12] != 0) &&
                   (uVar1 = *(uint *)(*(long *)(lVar10 + uVar12 * 8) + uVar17 * 4), uVar1 != 0)) {
                  uVar4 = index_of[uVar1] + index_of[puVar3[uVar12]];
                  uVar1 = (index_of[uVar1] - 0xff) + index_of[puVar3[uVar12]];
                  if (uVar4 < 0xff) {
                    uVar1 = uVar4;
                  }
                  uVar4 = alpha_of[uVar1];
                }
                uVar18 = uVar18 ^ uVar4;
                puVar2[uVar17] = uVar18;
                uVar12 = uVar12 + 1;
              } while ((in_R8 & 0xffffffff) != uVar12);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != (in_R9 & 0xffffffff));
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != ((ulong)puVar15 & 0xffffffff));
    }
    return (uint)ppuVar5;
  }
  gf_matr_mul_cold_1();
  if ((uint)puVar15 == uVar14) {
    pvVar6 = calloc((ulong)puVar15 & 0xffffffff,4);
    if ((uint)puVar15 != 0) {
      uVar16 = 0;
      do {
        *(undefined4 *)((long)pvVar6 + uVar16 * 4) = 0;
        if (uVar14 != 0) {
          uVar18 = *(uint *)((long)pvVar6 + uVar16 * 4);
          uVar17 = 0;
          do {
            uVar4 = 0;
            if (((ulong)M[uVar16][uVar17] != 0) &&
               (uVar1 = *(uint *)(lVar10 + uVar17 * 4), uVar1 != 0)) {
              uVar4 = index_of[M[uVar16][uVar17]] + index_of[uVar1];
              uVar1 = (index_of[uVar1] - 0xff) + index_of[M[uVar16][uVar17]];
              if (uVar4 < 0xff) {
                uVar1 = uVar4;
              }
              uVar4 = alpha_of[uVar1];
            }
            uVar18 = uVar18 ^ uVar4;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
          *(uint *)((long)pvVar6 + uVar16 * 4) = uVar18;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != ((ulong)puVar15 & 0xffffffff));
    }
    return (uint)pvVar6;
  }
  gf_matr_mul_vector_cold_1();
  uVar14 = (uint)puVar15;
  if (uVar14 != 2 && uVar14 != cols_00) {
    gf_matr_inv_cold_1();
    if ((int)M == 2) {
      puVar8 = (undefined8 *)calloc(5,4);
      *puVar8 = 0xe700000074;
      puVar8[1] = 0x1e000000d8;
      *(undefined4 *)(puVar8 + 2) = 1;
      uVar9 = 5;
    }
    else {
      if ((int)M != 1) {
        return 0;
      }
      puVar8 = (undefined8 *)calloc(2,4);
      *puVar8 = 0x100000002;
      uVar9 = 2;
    }
    if (puVar15 != (undefined4 *)0x0) {
      *puVar15 = uVar9;
    }
    return (uint)puVar8;
  }
  uVar4 = gf_matr_det(M,uVar14,cols_00);
  ppuVar5 = matrix_copy(M,uVar14,cols_00);
  ppuVar7 = matrix_new(uVar14,cols_00);
  puVar2 = ppuVar5[1];
  uVar18 = **ppuVar5;
  **ppuVar5 = puVar2[1];
  puVar2[1] = uVar18;
  if (uVar14 != 0) {
    uVar16 = 0;
    do {
      if (cols_00 != 0) {
        puVar2 = ppuVar5[uVar16];
        puVar3 = ppuVar7[uVar16];
        uVar17 = 0;
        do {
          uVar12 = (ulong)puVar2[uVar17];
          if (uVar12 != 0 && uVar4 != 0) {
            iVar11 = index_of[uVar12] - index_of[uVar4];
            iVar13 = iVar11 + 0xff;
            if (-1 < iVar11) {
              iVar13 = iVar11;
            }
            uVar18 = alpha_of[iVar13];
          }
          else {
            uVar18 = -(uint)(uVar12 != 0);
          }
          puVar3[uVar17] = uVar18;
          uVar17 = uVar17 + 1;
        } while (cols_00 != uVar17);
      }
      uVar16 = uVar16 + 1;
      uVar18 = cols_00;
    } while (uVar16 != ((ulong)puVar15 & 0xffffffff));
  }
  matrix_free(ppuVar5,uVar14,uVar18);
  return (uint)ppuVar7;
}

Assistant:

uint32_t gf_matr_det(uint32_t **M, uint32_t rows, uint32_t cols)
{
    if (rows != cols && rows != 2)
        fatal("gf_det", "only 2x2 matrix\n");

    uint32_t first = gf_mul(M[0][0], M[1][1]);
    uint32_t second = gf_mul(M[1][0], M[0][1]);
    return gf_sum(first, second);
}